

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rendering_process.cpp
# Opt level: O0

void RenderingProcess::render(registry *p_reg)

{
  registry *p_reg_local;
  
  OpenGLSettings::update();
  prepare_shadow(p_reg);
  render_normal(p_reg);
  SkyboxSystem::render(p_reg);
  AkarinImgui::render(p_reg);
  AkarinGLFW::swap_buffers();
  return;
}

Assistant:

void RenderingProcess::render(
    entt::registry &p_reg) noexcept
{
    OpenGLSettings::update();
    prepare_shadow(p_reg);
    render_normal(p_reg);

    SkyboxSystem::render(p_reg);
    AkarinImgui::render(p_reg);
    AkarinGLFW::swap_buffers();
}